

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_version.c
# Opt level: O2

void test_version(void)

{
  byte bVar1;
  size_t sVar2;
  wchar_t wVar3;
  ulong in_RAX;
  char *_v1;
  char *pcVar4;
  ushort **ppuVar5;
  long lVar6;
  long lVar7;
  char cVar8;
  size_t sVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  byte *pbVar13;
  byte *_v1_00;
  byte *pbVar14;
  ulong local_38;
  
  local_38 = in_RAX;
  wVar3 = systemf("%s --version >version.stdout 2>version.stderr",testprog);
  failure("Unable to run %s --version",testprog);
  wVar3 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                           ,L'(',(uint)(wVar3 == L'\0'),"r == 0",(void *)0x0);
  if (wVar3 != L'\0') {
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
               ,L',',"version.stderr");
    _v1 = slurpfile(&local_38,"version.stdout");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                     ,L'0',(uint)(6 < local_38),"s > 6",(void *)0x0);
    failure("Version must start with \'bsdcat\': ``%s\'\'",_v1);
    wVar3 = assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                                ,L'2',_v1,"q","bsdcat ","\"bsdcat \"",7,"7",(void *)0x0);
    if (wVar3 != L'\0') {
      pcVar10 = _v1 + local_38;
      local_38 = local_38 - 7;
      for (pcVar4 = _v1 + 7;
          (pcVar11 = pcVar10, local_38 != 0 &&
          (pcVar11 = pcVar4, *pcVar4 == '.' || (byte)(*pcVar4 - 0x30U) < 10)); pcVar4 = pcVar4 + 1)
      {
        local_38 = local_38 - 1;
      }
      lVar7 = 0;
      failure("No space after bsdcat version: ``%s\'\'",_v1);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                       ,L'<',(uint)(1 < local_38),"s > 1",(void *)0x0);
      uVar12 = (ulong)((byte)(*pcVar11 + 0x9fU) < 4);
      failure("No space after bsdcat version: ``%s\'\'",_v1);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                       ,L'A',(uint)(pcVar11[uVar12] == ' '),"*q == \' \'",(void *)0x0);
      local_38 = local_38 - 1;
      failure("No `-\' between bsdcat and libarchive versions: ``%s\'\'",_v1);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                          ,L'E',pcVar11 + uVar12 + 1,"q","- ","\"- \"",2,"2",(void *)0x0);
      local_38 = local_38 - 2;
      failure("Not long enough for libarchive version: ``%s\'\'",_v1);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                       ,L'I',(uint)(0xb < local_38),"s > 11",(void *)0x0);
      failure("Libarchive version must start with `libarchive\': ``%s\'\'",_v1);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                          ,L'K',pcVar11 + uVar12 + 3,"q","libarchive ","\"libarchive \"",0xb,"11",
                          (void *)0x0);
      pcVar4 = pcVar11 + uVar12 + local_38 + 3;
      lVar6 = 0;
      while( true ) {
        sVar9 = (local_38 + lVar6) - 0xb;
        if (sVar9 == 0) break;
        cVar8 = pcVar11[lVar7 + uVar12 + 0xe];
        if (cVar8 != '.' && 9 < (byte)(cVar8 - 0x30U)) {
          pcVar4 = pcVar11 + ((uVar12 + 0xe) - lVar6);
          goto LAB_00107b51;
        }
        lVar6 = lVar6 + -1;
        lVar7 = lVar7 + 1;
      }
      cVar8 = *pcVar4;
LAB_00107b51:
      pbVar14 = (byte *)(pcVar4 + ((byte)(cVar8 + 0x9fU) < 4));
      pbVar13 = pbVar14 + local_38 + lVar6 + -0xb;
      sVar2 = (local_38 + lVar6) - 0xc;
      local_38 = sVar9;
      while (sVar9 = sVar2, _v1_00 = pbVar13, sVar9 != 0xffffffffffffffff) {
        bVar1 = *pbVar14;
        if (((0x2f < (ulong)bVar1) || ((0xc00100000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
           (ppuVar5 = __ctype_b_loc(), _v1_00 = pbVar14, ((*ppuVar5)[(char)bVar1] & 8) == 0)) break;
        pbVar14 = pbVar14 + 1;
        local_38 = sVar9;
        sVar2 = sVar9 - 1;
      }
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                       ,L'[',(uint)(sVar9 != 0xffffffffffffffff),"s >= 1",(void *)0x0);
      failure("Version output must end with \\n or \\r\\n");
      if (*_v1_00 == 0xd) {
        _v1_00 = _v1_00 + 1;
        local_38 = local_38 - 1;
      }
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cat/test/test_version.c"
                          ,L'_',_v1_00,"q","\n","\"\\n\"",1,"1",(void *)0x0);
      free(_v1);
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_version)
{
	int r;
	char *p, *q;
	size_t s;


	r = systemf("%s --version >version.stdout 2>version.stderr", testprog);
	failure("Unable to run %s --version", testprog);
	if (!assert(r == 0))
		return;

	/* --version should generate nothing to stdout. */
	assertEmptyFile("version.stderr");
	/* Verify format of version message. */
	q = p = slurpfile(&s, "version.stdout");
	/* Version message should start with name of program, then space. */
	assert(s > 6);
	failure("Version must start with 'bsdcat': ``%s''", p);
	if (!assertEqualMem(q, "bsdcat ", 7))
		return;
	q += 7; s -= 7;
	/* Version number is a series of digits and periods. */
	while (s > 0 && (*q == '.' || (*q >= '0' && *q <= '9'))) {
		++q;
		--s;
	}
	/* Version number terminated by space. */
	failure("No space after bsdcat version: ``%s''", p);
	assert(s > 1);
	/* Skip a single trailing a,b,c, or d. */
	if (*q == 'a' || *q == 'b' || *q == 'c' || *q == 'd')
		++q;
	failure("No space after bsdcat version: ``%s''", p);
	assert(*q == ' ');
	++q; --s;
	/* Separator. */
	failure("No `-' between bsdcat and libarchive versions: ``%s''", p);
	assertEqualMem(q, "- ", 2);
	q += 2; s -= 2;
	/* libarchive name and version number */
	failure("Not long enough for libarchive version: ``%s''", p);
	assert(s > 11);
	failure("Libarchive version must start with `libarchive': ``%s''", p);
	assertEqualMem(q, "libarchive ", 11);
	q += 11; s -= 11;
	/* Version number is a series of digits and periods. */
	while (s > 0 && (*q == '.' || (*q >= '0' && *q <= '9'))) {
		++q;
		--s;
	}
	/* Skip a single trailing a,b,c, or d. */
	if (*q == 'a' || *q == 'b' || *q == 'c' || *q == 'd')
		++q;
	/* Skip arbitrary third-party version numbers. */
	while (s > 0 && (*q == ' ' || *q == '/' || *q == '.' || isalnum(*q))) {
		++q;
		--s;
	}
	/* All terminated by end-of-line. */
	assert(s >= 1);
	/* Skip an optional CR character (e.g., Windows) */
	failure("Version output must end with \\n or \\r\\n");
	if (*q == '\r') { ++q; --s; }
	assertEqualMem(q, "\n", 1);
	free(p);
}